

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_hash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar1 = *arguments;
  uVar2 = *(ulong *)(sVar1 + 0x10);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    uVar2 = (ulong)(*(uint *)(uVar2 + 8) >> 10);
  }
  else {
    uVar2 = uVar2 * 0x41c64e6d;
  }
  uVar4 = *(ulong *)(sVar1 + 0x18);
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 8) >> 10);
  }
  else {
    uVar4 = uVar4 * 0x41c64e6d;
  }
  uVar3 = *(ulong *)(sVar1 + 0x20);
  if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
    uVar3 = (ulong)(*(uint *)(uVar3 + 8) >> 10);
  }
  else {
    uVar3 = uVar3 * 0x41c64e6d;
  }
  return ((uVar4 + uVar2 * 0x41c64e6d) * 0x41c64e6d + uVar3) * 0x10 & 0x7ffffffffffffff0 | 0xb;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_hash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    size_t hash = sysbvm_hashConcatenate(
        sysbvm_hashConcatenate(sysbvm_tuple_identityHash(sourcePosition->sourceCode),
        sysbvm_tuple_identityHash(sourcePosition->startIndex)),
            sysbvm_tuple_identityHash(sourcePosition->endIndex));

    return sysbvm_tuple_size_encode(context, hash);
}